

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

void __thiscall draco::PointCloud::DeduplicatePointIds(PointCloud *this)

{
  bool bVar1;
  pointer ppVar2;
  reference this_00;
  PointCloud *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<IndexType<unsigned_int,_PointIndex_tag_type_>,_IndexType<unsigned_int,_PointIndex_tag_type_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  iterator it;
  PointIndex i;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  unique_points;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  index_map;
  int32_t num_unique_points;
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  unique_point_map;
  key_equal point_compare;
  hasher point_hash;
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  *in_stack_fffffffffffffeb8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  _Node_iterator_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
  in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffee8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  *in_stack_fffffffffffffef0;
  uint local_e4;
  _Node_iterator_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
  local_e0;
  undefined1 local_d8;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_cc;
  pair<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  local_c8;
  _Node_iterator_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
  local_c0;
  _Node_iterator_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
  local_b8;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_ac;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  ValueType local_78;
  
  std::
  allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::allocator((allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
               *)0x19cd29);
  std::
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::unordered_map((unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                   *)in_stack_fffffffffffffed0._M_cur,
                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                  (hasher *)in_stack_fffffffffffffec0,(key_equal *)in_stack_fffffffffffffeb8,
                  (allocator_type *)0x19cd50);
  std::
  allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::~allocator((allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                *)0x19cd5f);
  local_78 = 0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  ::IndexTypeVector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            *)0x19cd93);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_ac,0);
  while (bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                           (&local_ac,&in_RDI->num_points_), bVar1) {
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
         ::find(in_stack_fffffffffffffeb8,(key_type *)0x19cde7);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
         ::end(in_stack_fffffffffffffeb8);
    bVar1 = std::__detail::operator!=(&local_b8,&local_c0);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_false,_true>
                             *)0x19ce3b);
      this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                ::operator[](in_stack_fffffffffffffec0,
                             (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                             in_stack_fffffffffffffeb8);
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(this_00,&ppVar2->second);
    }
    else {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_cc,local_78);
      local_c8 = std::
                 make_pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>&,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>
                           ((IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                            in_stack_fffffffffffffeb8,
                            (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)0x19cf0d);
      _Var3 = std::
              unordered_map<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,draco::PointCloud::DeduplicatePointIds()::$_0,draco::PointCloud::DeduplicatePointIds()::$_1,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>const,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>>
              ::
              insert<std::pair<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                        ((unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                          *)in_stack_fffffffffffffed0._M_cur,
                         (pair<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                          *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffed0._M_cur =
           (__node_type *)
           _Var3.first.
           super__Node_iterator_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
           ._M_cur;
      in_stack_fffffffffffffecf = _Var3.second;
      local_e4 = local_78;
      local_e0._M_cur = in_stack_fffffffffffffed0._M_cur;
      local_d8 = in_stack_fffffffffffffecf;
      local_78 = local_78 + 1;
      in_stack_fffffffffffffec0 =
           (IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
            *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
              ::operator[](in_stack_fffffffffffffec0,
                           (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                           in_stack_fffffffffffffeb8);
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)in_stack_fffffffffffffec0,
                 &local_e4);
      std::
      vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                   *)in_stack_fffffffffffffed0._M_cur,
                  (value_type *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    }
    IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_ac);
  }
  if (local_78 != in_RDI->num_points_) {
    (*in_RDI->_vptr_PointCloud[6])(in_RDI,local_90,local_a8);
    set_num_points(in_RDI,local_78);
  }
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::~vector((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             *)in_stack_fffffffffffffed0._M_cur);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
                      *)0x19d038);
  std::
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::~unordered_map((unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                    *)0x19d045);
  return;
}

Assistant:

void PointCloud::DeduplicatePointIds() {
  // Hashing function for a single vertex.
  auto point_hash = [this](PointIndex p) {
    PointIndex::ValueType hash = 0;
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id = attribute(i)->mapped_index(p);
      hash = static_cast<uint32_t>(HashCombine(att_id.value(), hash));
    }
    return hash;
  };
  // Comparison function between two vertices.
  auto point_compare = [this](PointIndex p0, PointIndex p1) {
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id0 = attribute(i)->mapped_index(p0);
      const AttributeValueIndex att_id1 = attribute(i)->mapped_index(p1);
      if (att_id0 != att_id1) {
        return false;
      }
    }
    return true;
  };

  std::unordered_map<PointIndex, PointIndex, decltype(point_hash),
                     decltype(point_compare)>
      unique_point_map(num_points_, point_hash, point_compare);
  int32_t num_unique_points = 0;
  IndexTypeVector<PointIndex, PointIndex> index_map(num_points_);
  std::vector<PointIndex> unique_points;
  // Go through all vertices and find their duplicates.
  for (PointIndex i(0); i < num_points_; ++i) {
    const auto it = unique_point_map.find(i);
    if (it != unique_point_map.end()) {
      index_map[i] = it->second;
    } else {
      unique_point_map.insert(std::make_pair(i, PointIndex(num_unique_points)));
      index_map[i] = num_unique_points++;
      unique_points.push_back(i);
    }
  }
  if (num_unique_points == num_points_) {
    return;  // All vertices are already unique.
  }

  ApplyPointIdDeduplication(index_map, unique_points);
  set_num_points(num_unique_points);
}